

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.periodic.c
# Opt level: O0

int ngai_peri_get_range_
              (Integer ndim,Integer *dims,Integer *lo_orig,Integer *hi_orig,Integer (*range) [6],
              Integer *range_num,Integer (*offset) [3],Integer op_code)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long in_RCX;
  long lVar5;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  Integer id;
  Integer rmndr;
  Integer i;
  Integer hi [7];
  Integer lo [7];
  long local_2c8 [2];
  int aiStack_2b8 [2];
  long alStack_2b0 [2];
  int aiStack_2a0 [2];
  long alStack_298 [2];
  int aiStack_288 [110];
  long local_d0;
  long local_c8;
  long local_c0;
  long alStack_b8 [7];
  Integer no_shift;
  Integer is_regular_patch;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  int local_4;
  
  local_c0 = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if (local_10 <= local_c0) {
      bVar3 = true;
      for (local_c0 = 0; local_c0 < local_10; local_c0 = local_c0 + 1) {
        if (*(long *)(local_18 + local_c0 * 8) < (&is_regular_patch)[local_c0]) {
          local_c8 = (&is_regular_patch)[local_c0] % *(long *)(local_18 + local_c0 * 8);
          local_d0 = ((&is_regular_patch)[local_c0] - local_c8) / *(long *)(local_18 + local_c0 * 8)
          ;
          (&is_regular_patch)[local_c0] =
               (&is_regular_patch)[local_c0] - local_d0 * *(long *)(local_18 + local_c0 * 8);
          alStack_b8[local_c0] =
               alStack_b8[local_c0] - local_d0 * *(long *)(local_18 + local_c0 * 8);
          if (local_d0 != 0) {
            bVar3 = false;
          }
        }
        if (alStack_b8[local_c0] < 1) {
          local_c8 = -alStack_b8[local_c0] % *(long *)(local_18 + local_c0 * 8);
          local_d0 = (alStack_b8[local_c0] + local_c8) / *(long *)(local_18 + local_c0 * 8) + 1;
          (&is_regular_patch)[local_c0] =
               (&is_regular_patch)[local_c0] + local_d0 * *(long *)(local_18 + local_c0 * 8);
          alStack_b8[local_c0] =
               alStack_b8[local_c0] + local_d0 * *(long *)(local_18 + local_c0 * 8);
          if (local_d0 != 0) {
            bVar3 = false;
          }
        }
      }
      for (local_c0 = 0; local_c0 < local_10; local_c0 = local_c0 + 1) {
        local_2c8[local_c0 * 9] = 0;
        local_2c8[local_c0 * 9 + 1] = 0;
        aiStack_2b8[local_c0 * 0x12] = 0;
        alStack_2b0[local_c0 * 9] = 1;
        alStack_2b0[local_c0 * 9 + 1] = *(long *)(local_18 + local_c0 * 8);
        aiStack_2a0[local_c0 * 0x12] = 0;
        alStack_298[local_c0 * 9] = *(long *)(local_18 + local_c0 * 8) + 1;
        alStack_298[local_c0 * 9 + 1] = 0;
        aiStack_288[local_c0 * 0x12] = 0;
        if ((&is_regular_patch)[local_c0] < 1) {
          local_2c8[local_c0 * 9] = (&is_regular_patch)[local_c0];
          aiStack_2b8[local_c0 * 0x12] = 1;
        }
        else if (0 < (&is_regular_patch)[local_c0]) {
          alStack_2b0[local_c0 * 9] = (&is_regular_patch)[local_c0];
          aiStack_2a0[local_c0 * 0x12] = 1;
        }
        if (((&is_regular_patch)[local_c0] < 1) &&
           (*(long *)(local_18 + local_c0 * 8) < alStack_b8[local_c0])) {
          aiStack_2a0[local_c0 * 0x12] = 1;
        }
        if (*(long *)(local_18 + local_c0 * 8) < alStack_b8[local_c0]) {
          alStack_298[local_c0 * 9 + 1] = alStack_b8[local_c0];
          aiStack_288[local_c0 * 0x12] = 1;
        }
        else if (alStack_b8[local_c0] <= *(long *)(local_18 + local_c0 * 8)) {
          alStack_2b0[local_c0 * 9 + 1] = alStack_b8[local_c0];
          aiStack_2a0[local_c0 * 0x12] = 1;
        }
      }
      bVar2 = true;
      for (local_c0 = 0; local_c0 < local_10; local_c0 = local_c0 + 1) {
        if ((aiStack_2b8[local_c0 * 0x12] != 0) || (aiStack_288[local_c0 * 0x12] != 0)) {
          bVar2 = false;
        }
      }
      if ((bVar2) && (bVar3)) {
        local_4 = 100;
      }
      else {
        for (local_c0 = 0; local_c0 < local_10; local_c0 = local_c0 + 1) {
          *(undefined8 *)(local_38 + local_c0 * 8) = 0;
          if (aiStack_2b8[local_c0 * 0x12] != 0) {
            *(long *)(local_30 + local_c0 * 0x30 + *(long *)(local_38 + local_c0 * 8) * 0x10) =
                 local_2c8[local_c0 * 9] + *(long *)(local_18 + local_c0 * 8);
            *(long *)(local_30 + local_c0 * 0x30 + 8 + *(long *)(local_38 + local_c0 * 8) * 0x10) =
                 local_2c8[local_c0 * 9 + 1] + *(long *)(local_18 + local_c0 * 8);
            *(long *)(in_stack_00000008 + local_c0 * 0x18 + *(long *)(local_38 + local_c0 * 8) * 8)
                 = local_2c8[local_c0 * 9] - (&is_regular_patch)[local_c0];
            *(long *)(local_38 + local_c0 * 8) = *(long *)(local_38 + local_c0 * 8) + 1;
          }
          if (aiStack_2a0[local_c0 * 0x12] != 0) {
            *(long *)(local_30 + local_c0 * 0x30 + *(long *)(local_38 + local_c0 * 8) * 0x10) =
                 alStack_2b0[local_c0 * 9];
            *(long *)(local_30 + local_c0 * 0x30 + 8 + *(long *)(local_38 + local_c0 * 8) * 0x10) =
                 alStack_2b0[local_c0 * 9 + 1];
            *(long *)(in_stack_00000008 + local_c0 * 0x18 + *(long *)(local_38 + local_c0 * 8) * 8)
                 = alStack_2b0[local_c0 * 9] - (&is_regular_patch)[local_c0];
            *(long *)(local_38 + local_c0 * 8) = *(long *)(local_38 + local_c0 * 8) + 1;
          }
          if (aiStack_288[local_c0 * 0x12] != 0) {
            *(long *)(local_30 + local_c0 * 0x30 + *(long *)(local_38 + local_c0 * 8) * 0x10) =
                 alStack_298[local_c0 * 9] - *(long *)(local_18 + local_c0 * 8);
            *(long *)(local_30 + local_c0 * 0x30 + 8 + *(long *)(local_38 + local_c0 * 8) * 0x10) =
                 alStack_298[local_c0 * 9 + 1] - *(long *)(local_18 + local_c0 * 8);
            *(long *)(in_stack_00000008 + local_c0 * 0x18 + *(long *)(local_38 + local_c0 * 8) * 8)
                 = alStack_298[local_c0 * 9] - (&is_regular_patch)[local_c0];
            *(long *)(local_38 + local_c0 * 8) = *(long *)(local_38 + local_c0 * 8) + 1;
          }
        }
        local_4 = 1;
      }
      return local_4;
    }
    (&is_regular_patch)[local_c0] = *(Integer *)(local_20 + local_c0 * 8);
    alStack_b8[local_c0] = *(long *)(local_28 + local_c0 * 8);
    if (((alStack_b8[local_c0] - (&is_regular_patch)[local_c0]) + 1 < 1) ||
       (lVar4 = (alStack_b8[local_c0] - (&is_regular_patch)[local_c0]) + 1,
       lVar1 = *(long *)(local_18 + local_c0 * 8), lVar5 = lVar1 * 2,
       lVar4 != lVar5 && SBORROW8(lVar4,lVar5) == lVar4 + lVar1 * -2 < 0)) break;
    local_c0 = local_c0 + 1;
  }
  return 0;
}

Assistant:

static int ngai_peri_get_range_(Integer ndim, Integer *dims, Integer *lo_orig, Integer *hi_orig,
                         Integer range[][RANGE_BOUND], Integer range_num[],
                         Integer offset[][RANGE_BOUND/2], Integer op_code)
/*
  ndim                   - dimension of array [input]
  dims[]                 - dimensions of each array component [input]
  lo_orig[]              - lower bounds of request
  hi_orig[]              - upper bounds of request
  range[][]              - adjusted ranges for requests [output]
  range_num[]            - number of ranges per axis 
  offset[]               - offset between original request and shifted request [output]
  op_code                - not used
*/
{
    Integer lo[MAXDIM], hi[MAXDIM];
    Integer i, rmndr, id;
    Range range_raw[MAXDIM];
    Integer is_regular_patch, no_shift;
 
    /* check the patch is valid or not */
    for (i=0; i<ndim; i++) {
      lo[i] = lo_orig[i];
      hi[i] = hi_orig[i];
      if ((hi[i] - lo[i] + 1) < 1 || (hi[i]-lo[i]+1) > 2*dims[i]) return 0;
    }
    /* move request so that it at least partially overlaps the array
     * (if necessary)
     */
    no_shift = 1;
    for(i=0; i<ndim; i++) {
      if (lo[i] > dims[i]) {
        rmndr = lo[i]%dims[i];
        id = (lo[i]-rmndr)/dims[i]; 
        lo[i] = lo[i] - id*dims[i];
        hi[i] = hi[i] - id*dims[i];
        if (id != 0) {
          no_shift = 0;
        }
      }
      if (hi[i] < 1) {
        rmndr = -hi[i]%dims[i];
        id = (hi[i]+rmndr)/dims[i]+1; 
        lo[i] = lo[i] + id*dims[i];
        hi[i] = hi[i] + id*dims[i];
        if (id != 0) {
          no_shift = 0;
        }
      }
    }
    /* break the lo and hi into the corresponding ranges
     *
     * lo (if < 1)         1                dims[i]      hi (if > dims[i])
     * |-------------------|------------------|------------------|
     * Example:
     *    lo[0] = -3 hi[0] = 5 dims[0] = 10 then
     *    range_raw[0].low.lo = -3  range_raw[0].low.hi = 0
     *    range_raw[0].low.isvalid = 1
     *    range_raw[0].mid.lo = 1   range_raw[0].mid.hi = 5
     *    range_raw[0].mid.isvalid = 1
     *    range_raw[0].hig.isvalid = 0
     */
    for(i=0; i<ndim; i++) {
        /* initialize the dim range */
        range_raw[i].low.lo = 0; range_raw[i].low.hi = 0;
        range_raw[i].low.isvalid = 0;
        range_raw[i].mid.lo = 1; range_raw[i].mid.hi = dims[i];
        range_raw[i].mid.isvalid = 0;
        range_raw[i].hig.lo = dims[i]+1; range_raw[i].hig.hi = 0;
        range_raw[i].hig.isvalid = 0;
        
        if(lo[i] < 1) {
            range_raw[i].low.lo = lo[i];
            range_raw[i].low.isvalid = 1;
        } else if (lo[i] >= 1) {
            range_raw[i].mid.lo = lo[i];
            range_raw[i].mid.isvalid = 1;
        }

        if (lo[i] < 1 && hi[i] > dims[i]) {
            range_raw[i].mid.isvalid = 1;
        }


        if(hi[i] > dims[i]) {
            range_raw[i].hig.hi = hi[i];
            range_raw[i].hig.isvalid = 1;
        } else if (hi[i] <= dims[i]) {
            range_raw[i].mid.hi = hi[i];
            range_raw[i].mid.isvalid = 1;
        }

    }

    /* check if this is a regular patch, not periodic operation needed */
    is_regular_patch = 1;
    for(i=0; i<ndim; i++) 
        if(range_raw[i].low.isvalid || range_raw[i].hig.isvalid)
            is_regular_patch = 0;

    if(is_regular_patch && no_shift) return IS_REGULAR_PATCH;
    
    /* adjust the range so that they are in the range of 1 to dims[i] */
    for(i=0; i<ndim; i++) {
        range_num[i] = 0;
        if(range_raw[i].low.isvalid) {
            range[i][range_num[i]*2] = range_raw[i].low.lo + dims[i];
            range[i][range_num[i]*2+1] = range_raw[i].low.hi + dims[i];
            offset[i][range_num[i]] = range_raw[i].low.lo - lo[i];
            range_num[i]++;
        }
        if(range_raw[i].mid.isvalid) {
            range[i][range_num[i]*2] = range_raw[i].mid.lo;
            range[i][range_num[i]*2+1] = range_raw[i].mid.hi;
            offset[i][range_num[i]] = range_raw[i].mid.lo - lo[i];
            range_num[i]++;
        }
        if(range_raw[i].hig.isvalid) {
            range[i][range_num[i]*2] = range_raw[i].hig.lo - dims[i];
            range[i][range_num[i]*2+1] = range_raw[i].hig.hi - dims[i];
            offset[i][range_num[i]] = range_raw[i].hig.lo - lo[i];
            range_num[i]++;
        }  
    }
    
    return 1;
}